

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zeImageCreate
          (ze_context_handle_t hContext,ze_device_handle_t hDevice,ze_image_desc_t *desc,
          ze_image_handle_t *phImage)

{
  object_t<_ze_image_handle_t_*> *poVar1;
  unordered_map<object_t<_ze_image_handle_t_*>_*,__ze_image_handle_t_*,_std::hash<object_t<_ze_image_handle_t_*>_*>,_std::equal_to<object_t<_ze_image_handle_t_*>_*>,_std::allocator<std::pair<object_t<_ze_image_handle_t_*>_*const,__ze_image_handle_t_*>_>_>
  *this;
  bad_alloc *anon_var_0;
  object_t<_ze_image_handle_t_*> *local_80;
  pair<object_t<_ze_image_handle_t_*>_*const,__ze_image_handle_t_*> local_78;
  lock_guard<std::mutex> local_68;
  lock_guard<std::mutex> lock;
  _ze_image_handle_t *local_50;
  ze_image_handle_t internalHandlePtr;
  ze_pfnImageCreate_t pfnCreate;
  dditable_t *dditable;
  ze_image_handle_t *pp_Stack_30;
  ze_result_t result;
  ze_image_handle_t *phImage_local;
  ze_image_desc_t *desc_local;
  ze_device_handle_t hDevice_local;
  ze_context_handle_t hContext_local;
  
  dditable._4_4_ = 0;
  pfnCreate = *(ze_pfnImageCreate_t *)(hContext + 8);
  internalHandlePtr = *(ze_image_handle_t *)(pfnCreate + 0x378);
  if (internalHandlePtr == (ze_image_handle_t)0x0) {
    hContext_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hDevice_local = *(ze_device_handle_t *)hContext;
    desc_local = *(ze_image_desc_t **)hDevice;
    pp_Stack_30 = phImage;
    phImage_local = (ze_image_handle_t *)desc;
    dditable._4_4_ = (*(code *)internalHandlePtr)(hDevice_local,desc_local,desc,phImage);
    hContext_local._4_4_ = dditable._4_4_;
    if (dditable._4_4_ == ZE_RESULT_SUCCESS) {
      local_50 = *pp_Stack_30;
      poVar1 = singleton_factory_t<object_t<_ze_image_handle_t*>,_ze_image_handle_t*>::
               getInstance<_ze_image_handle_t*&,dditable_t*&>
                         ((singleton_factory_t<object_t<_ze_image_handle_t*>,_ze_image_handle_t*> *)
                          (context + 0x420),pp_Stack_30,(dditable_t **)&pfnCreate);
      *pp_Stack_30 = (ze_image_handle_t)poVar1;
      std::lock_guard<std::mutex>::lock_guard(&local_68,(mutex_type *)(context + 0x1500));
      this = (unordered_map<object_t<_ze_image_handle_t_*>_*,__ze_image_handle_t_*,_std::hash<object_t<_ze_image_handle_t_*>_*>,_std::equal_to<object_t<_ze_image_handle_t_*>_*>,_std::allocator<std::pair<object_t<_ze_image_handle_t_*>_*const,__ze_image_handle_t_*>_>_>
              *)(context + 0x1550);
      local_80 = singleton_factory_t<object_t<_ze_image_handle_t*>,_ze_image_handle_t*>::
                 getInstance<_ze_image_handle_t*&,dditable_t*&>
                           ((singleton_factory_t<object_t<_ze_image_handle_t*>,_ze_image_handle_t*>
                             *)(context + 0x420),&local_50,(dditable_t **)&pfnCreate);
      std::pair<object_t<_ze_image_handle_t_*>_*const,__ze_image_handle_t_*>::
      pair<object_t<_ze_image_handle_t_*>_*,__ze_image_handle_t_*&,_true>
                (&local_78,&local_80,&local_50);
      std::
      unordered_map<object_t<_ze_image_handle_t_*>_*,__ze_image_handle_t_*,_std::hash<object_t<_ze_image_handle_t_*>_*>,_std::equal_to<object_t<_ze_image_handle_t_*>_*>,_std::allocator<std::pair<object_t<_ze_image_handle_t_*>_*const,__ze_image_handle_t_*>_>_>
      ::insert(this,&local_78);
      std::lock_guard<std::mutex>::~lock_guard(&local_68);
      hContext_local._4_4_ = dditable._4_4_;
    }
  }
  return hContext_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeImageCreate(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        ze_device_handle_t hDevice,                     ///< [in] handle of the device
        const ze_image_desc_t* desc,                    ///< [in] pointer to image descriptor
        ze_image_handle_t* phImage                      ///< [out] pointer to handle of image object created
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_context_object_t*>( hContext )->dditable;
        auto pfnCreate = dditable->ze.Image.pfnCreate;
        if( nullptr == pfnCreate )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hContext = reinterpret_cast<ze_context_object_t*>( hContext )->handle;

        // convert loader handle to driver handle
        hDevice = reinterpret_cast<ze_device_object_t*>( hDevice )->handle;

        // forward to device-driver
        result = pfnCreate( hContext, hDevice, desc, phImage );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        try
        {
            // convert driver handle to loader handle
            ze_image_handle_t internalHandlePtr = *phImage;
            *phImage = reinterpret_cast<ze_image_handle_t>(
                context->ze_image_factory.getInstance( *phImage, dditable ) );
            // convert loader handle to driver handle and store in map
            {
                std::lock_guard<std::mutex> lock(context->image_handle_map_lock);
                context->image_handle_map.insert({context->ze_image_factory.getInstance( internalHandlePtr, dditable ), internalHandlePtr});
            }
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        return result;
    }